

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall soul::heart::WriteStream::visitExpressions(WriteStream *this,ExpressionVisitorFn fn)

{
  Expression *pEVar1;
  pool_ref<soul::heart::Expression> ref;
  pool_ref<soul::heart::Expression> local_28;
  AccessType local_1c;
  
  pEVar1 = (this->element).object;
  if (pEVar1 != (Expression *)0x0) {
    (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
    local_28.object = (this->element).object;
    if (local_28.object == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","getAsPoolRef",0x3a);
    }
    local_1c = read;
    if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0022ad9c;
    (*fn->_M_invoker)((_Any_data *)fn,&local_28,&local_1c);
    (this->element).object = local_28.object;
  }
  pEVar1 = (this->value).object;
  (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
  local_28.object = (Expression *)((ulong)local_28.object & 0xffffffff00000000);
  if ((fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*fn->_M_invoker)((_Any_data *)fn,&this->value,(AccessType *)&local_28);
    return;
  }
LAB_0022ad9c:
  std::__throw_bad_function_call();
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn) override
        {
            if (element != nullptr)
            {
                element->visitExpressions (fn, AccessType::read);
                auto ref = element.getAsPoolRef();
                fn (ref, AccessType::read);
                element = ref;
            }

            value->visitExpressions (fn, AccessType::read);
            fn (value, AccessType::read);
        }